

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int ffffrw(fitsfile *fptr,char *expr,long *rownum,int *status)

{
  int iVar1;
  int *in_RCX;
  undefined8 *in_RDX;
  ffffrw_workdata workData;
  ParseData lParse;
  char result;
  long naxes [5];
  long nelem;
  _func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *in_stack_00000158;
  int dtype;
  int constant;
  int naxis;
  int *in_stack_00000190;
  int *status_00;
  ParseData *lParse_00;
  fitsfile *fptr_00;
  fitsfile local_168 [3];
  long local_130;
  int local_120;
  long *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  fitsfile *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff30;
  long *in_stack_ffffffffffffff38;
  ParseData *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  undefined1 local_78 [80];
  undefined8 *local_28;
  int local_c;
  
  if (*in_RCX == 0) {
    lParse_00 = (ParseData *)local_78;
    status_00 = (int *)(local_78 + 0x44);
    fptr_00 = local_168;
    local_78._72_8_ = in_RCX;
    local_28 = in_RDX;
    iVar1 = ffiprs(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,
                   in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff48);
    if (iVar1 == 0) {
      local_78[0x40] = (long)local_78._48_8_ < 0;
      if ((bool)local_78[0x40]) {
        local_78._48_8_ = -local_78._48_8_;
      }
      local_78._65_3_ = 0;
      if ((local_78._60_4_ == 0xe) && (local_78._48_8_ == 1)) {
        *local_28 = 0;
        if (local_78._64_4_ == 0) {
          iVar1 = ffiter((int)expr,(iteratorCol *)rownum,(long)status,_constant,in_stack_00000158,
                         (void *)nelem,in_stack_00000190);
          if (iVar1 == -1) {
            *(int *)local_78._72_8_ = 0;
          }
        }
        else if ((*(char *)(local_130 + (long)local_120 * 0x180 + 0x80) != '\0') &&
                (ffgnrw(fptr_00,(long *)lParse_00,status_00), local_78._48_8_ != 0)) {
          *local_28 = 1;
        }
        ffcprs(lParse_00);
        local_c = *(int *)local_78._72_8_;
      }
      else {
        ffcprs(lParse_00);
        ffpmsg((char *)0x131a8c);
        *(int *)local_78._72_8_ = 0x1b0;
        local_c = 0x1b0;
      }
    }
    else {
      ffcprs(lParse_00);
      local_c = *(int *)local_78._72_8_;
    }
  }
  else {
    local_c = *in_RCX;
  }
  return local_c;
}

Assistant:

int ffffrw( fitsfile *fptr,         /* I - Input FITS file                   */
            char     *expr,         /* I - Boolean expression                */
            long     *rownum,       /* O - First row of table to eval to T   */
            int      *status )      /* O - Error status                      */
/*                                                                           */
/* Evaluate a boolean expression, returning the row number of the first      */
/* row which evaluates to TRUE                                               */
/*---------------------------------------------------------------------------*/
{
   int naxis, constant, dtype;
   long nelem, naxes[MAXDIMS];
   char result;
   ParseData lParse;

   if( *status ) return( *status );

   if( ffiprs( fptr, 0, expr, MAXDIMS, &dtype, &nelem, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   if( dtype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   *rownum = 0;
   if( constant ) { /* No need to call parser... have result from ffiprs */
      result = lParse.Nodes[lParse.resultNode].value.data.log;
      if( result ) {
         /*  Make sure there is at least 1 row in table  */
         ffgnrw( fptr, &nelem, status );
         if( nelem )
            *rownum = 1;
      }
   } else {
      ffffrw_workdata workData;
      workData.prownum = rownum;
      workData.lParse = &lParse;
      if( ffiter( lParse.nCols, lParse.colData, 0, 0,
                  ffffrw_work, (void*)&workData, status ) == -1 )
         *status = 0;  /* -1 indicates exitted without error before end... OK */
   }

   ffcprs(&lParse);
   return(*status);
}